

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  Cluster **ppCVar1;
  long off;
  undefined1 auVar2 [16];
  bool bVar3;
  Cluster *pCluster;
  BlockEntry *pBVar4;
  Cluster **ppCVar5;
  long lVar6;
  Cluster **ppCVar7;
  
  ppCVar7 = this->m_clusters;
  off = tp->m_pos;
  ppCVar5 = ppCVar7 + this->m_clusterCount + this->m_clusterPreloadCount;
  do {
    while( true ) {
      if (ppCVar5 <= ppCVar7) {
        pCluster = Cluster::Create(this,-1,off);
        if (pCluster != (Cluster *)0x0) {
          bVar3 = PreloadCluster(this,pCluster,(long)ppCVar7 - (long)this->m_clusters >> 3);
          if (bVar3) goto LAB_00152bca;
          Cluster::~Cluster(pCluster);
          operator_delete(pCluster);
        }
        return (BlockEntry *)0x0;
      }
      auVar2._8_8_ = (long)ppCVar5 - (long)ppCVar7 >> 0x3f;
      auVar2._0_8_ = (long)ppCVar5 - (long)ppCVar7 >> 3;
      ppCVar1 = ppCVar7 + SUB168(auVar2 / SEXT816(2),0);
      pCluster = *ppCVar1;
      lVar6 = pCluster->m_element_start - pCluster->m_pSegment->m_start;
      if (off <= lVar6) break;
      ppCVar7 = ppCVar1 + 1;
    }
    ppCVar5 = ppCVar1;
  } while (off < lVar6);
LAB_00152bca:
  pBVar4 = Cluster::GetEntry(pCluster,cp,tp);
  return pBVar4;
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}